

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseLineCase::BaseLineCase
          (BaseLineCase *this,Context *context,char *name,char *desc,GLenum primitiveDrawType,
          PrimitiveWideness wideness)

{
  float local_34;
  PrimitiveWideness wideness_local;
  GLenum primitiveDrawType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BaseLineCase *this_local;
  
  BaseRenderingCase::BaseRenderingCase(&this->super_BaseRenderingCase,context,name,desc,0x100);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_0327b518;
  this->m_iteration = 0;
  this->m_iterationCount = 3;
  this->m_primitiveDrawType = primitiveDrawType;
  this->m_primitiveWideness = wideness;
  this->m_allIterationsPassed = true;
  this->m_multisampleRelaxationRequired = false;
  local_34 = 5.0;
  if (this->m_primitiveWideness != PRIMITIVEWIDENESS_WIDE) {
    local_34 = 1.0;
  }
  (this->super_BaseRenderingCase).m_lineWidth = local_34;
  return;
}

Assistant:

BaseLineCase::BaseLineCase (Context& context, const char* name, const char* desc, glw::GLenum primitiveDrawType, PrimitiveWideness wideness)
	: BaseRenderingCase					(context, name, desc)
	, m_iteration						(0)
	, m_iterationCount					(3)
	, m_primitiveDrawType				(primitiveDrawType)
	, m_primitiveWideness				(wideness)
	, m_allIterationsPassed				(true)
	, m_multisampleRelaxationRequired	(false)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);
	m_lineWidth = (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) ? (s_wideSize) : (1.0f);
}